

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.cpp
# Opt level: O0

shared_ptr<Form> buildList(shared_ptr<Form> *forms,int count)

{
  element_type *peVar1;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  shared_ptr<Form> sVar3;
  shared_ptr<Form> *f;
  SymbolTable *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffe4;
  uint3 in_stack_ffffffffffffffe8;
  uint uVar4;
  
  uVar4 = (uint)in_stack_ffffffffffffffe8;
  std::make_shared<Form>();
  peVar1 = std::__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x188053);
  peVar1->kind = PAIR;
  std::__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x18806d);
  std::shared_ptr<Form>::operator=
            ((shared_ptr<Form> *)in_RDI,(shared_ptr<Form> *)in_stack_ffffffffffffff98);
  if (in_EDX == 1) {
    SymbolTable::getEmptyPair(in_stack_ffffffffffffff98);
    std::__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x188107);
    std::shared_ptr<Form>::operator=
              ((shared_ptr<Form> *)in_RDI,(shared_ptr<Form> *)in_stack_ffffffffffffff98);
    std::shared_ptr<Form>::~shared_ptr((shared_ptr<Form> *)0x188126);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    buildList((shared_ptr<Form> *)CONCAT44(in_EDX,uVar4),in_stack_ffffffffffffffe4);
    std::__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1880af);
    std::shared_ptr<Form>::operator=
              ((shared_ptr<Form> *)in_RDI,(shared_ptr<Form> *)in_stack_ffffffffffffff98);
    std::shared_ptr<Form>::~shared_ptr((shared_ptr<Form> *)0x1880ce);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Form>)sVar3.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Form> buildList(std::shared_ptr<Form>* forms, int count) {
  auto f = std::make_shared<Form>();
  f->kind = FormKind::PAIR;
  f->pair[0] = forms[0];
  if(count - 1) {
    f->pair[1] = buildList(forms + 1, count - 1);
  } else {
    f->pair[1] = gSymbolTable.getEmptyPair();
  }

  return f;
}